

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_check_pubkey_sw(mbedtls_ecp_group *grp,mbedtls_ecp_point *pt)

{
  int iVar1;
  bool bVar2;
  undefined1 local_58 [8];
  mbedtls_mpi RHS;
  mbedtls_mpi YY;
  int ret;
  mbedtls_ecp_point *pt_local;
  mbedtls_ecp_group *grp_local;
  
  iVar1 = mbedtls_mpi_cmp_int(&pt->X,0);
  if ((((iVar1 < 0) || (iVar1 = mbedtls_mpi_cmp_int(&pt->Y,0), iVar1 < 0)) ||
      (iVar1 = mbedtls_mpi_cmp_mpi(&pt->X,&grp->P), -1 < iVar1)) ||
     (iVar1 = mbedtls_mpi_cmp_mpi(&pt->Y,&grp->P), -1 < iVar1)) {
    grp_local._4_4_ = -0x4c80;
  }
  else {
    mbedtls_mpi_init((mbedtls_mpi *)&RHS.p);
    mbedtls_mpi_init((mbedtls_mpi *)local_58);
    YY.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&RHS.p,&pt->Y,&pt->Y);
    if ((YY.p._4_4_ == 0) &&
       (YY.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)local_58,&pt->X,&pt->X), YY.p._4_4_ == 0
       )) {
      if ((grp->A).p == (mbedtls_mpi_uint *)0x0) {
        YY.p._4_4_ = mbedtls_mpi_sub_int((mbedtls_mpi *)local_58,(mbedtls_mpi *)local_58,3);
        while (YY.p._4_4_ == 0) {
          bVar2 = false;
          if ((int)local_58._0_4_ < 0) {
            iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)local_58,0);
            bVar2 = iVar1 != 0;
          }
          if (!bVar2) goto LAB_0014181b;
          YY.p._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)local_58,(mbedtls_mpi *)local_58,&grp->P);
        }
      }
      else {
        YY.p._4_4_ = mbedtls_mpi_add_mod(grp,(mbedtls_mpi *)local_58,(mbedtls_mpi *)local_58,&grp->A
                                        );
        if (YY.p._4_4_ == 0) {
LAB_0014181b:
          YY.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)local_58,(mbedtls_mpi *)local_58,
                                           &pt->X);
          if (((YY.p._4_4_ == 0) &&
              (YY.p._4_4_ = mbedtls_mpi_add_mod(grp,(mbedtls_mpi *)local_58,(mbedtls_mpi *)local_58,
                                                &grp->B), YY.p._4_4_ == 0)) &&
             (iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&RHS.p,(mbedtls_mpi *)local_58), iVar1 != 0
             )) {
            YY.p._4_4_ = -0x4c80;
          }
        }
      }
    }
    mbedtls_mpi_free((mbedtls_mpi *)&RHS.p);
    mbedtls_mpi_free((mbedtls_mpi *)local_58);
    grp_local._4_4_ = YY.p._4_4_;
  }
  return grp_local._4_4_;
}

Assistant:

static int ecp_check_pubkey_sw( const mbedtls_ecp_group *grp, const mbedtls_ecp_point *pt )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi YY, RHS;

    /* pt coordinates must be normalized for our checks */
    if( mbedtls_mpi_cmp_int( &pt->X, 0 ) < 0 ||
        mbedtls_mpi_cmp_int( &pt->Y, 0 ) < 0 ||
        mbedtls_mpi_cmp_mpi( &pt->X, &grp->P ) >= 0 ||
        mbedtls_mpi_cmp_mpi( &pt->Y, &grp->P ) >= 0 )
        return( MBEDTLS_ERR_ECP_INVALID_KEY );

    mbedtls_mpi_init( &YY ); mbedtls_mpi_init( &RHS );

    /*
     * YY = Y^2
     * RHS = X (X^2 + A) + B = X^3 + A X + B
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &YY,  &pt->Y,   &pt->Y  ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &RHS, &pt->X,   &pt->X  ) );

    /* Special case for A = -3 */
    if( grp->A.p == NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &RHS, &RHS, 3       ) );  MOD_SUB( RHS );
    }
    else
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mod( grp, &RHS, &RHS, &grp->A ) );
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &RHS, &RHS,     &pt->X  ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mod( grp, &RHS, &RHS,     &grp->B ) );

    if( mbedtls_mpi_cmp_mpi( &YY, &RHS ) != 0 )
        ret = MBEDTLS_ERR_ECP_INVALID_KEY;

cleanup:

    mbedtls_mpi_free( &YY ); mbedtls_mpi_free( &RHS );

    return( ret );
}